

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeView::sizeHintForColumn(QTreeView *this,int column)

{
  byte bVar1;
  QTreeViewPrivate *this_00;
  QArrayData *pQVar2;
  QTreeViewItem *pQVar3;
  long lVar4;
  int iVar5;
  uint firstVisual;
  uint uVar6;
  int iVar7;
  int iVar8;
  QWidget *pQVar9;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  QTreeViewItem *pQVar14;
  int iVar15;
  long in_FS_OFFSET;
  int offset;
  QStyleOptionViewItem option;
  QModelIndex local_148;
  QModelIndex local_128;
  int local_10c;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this_00->viewItems).d.size == 0) {
    iVar7 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    pQVar2 = &((this_00->viewItems).d.d)->super_QArrayData;
    pQVar3 = (this_00->viewItems).d.ptr;
    lVar4 = (this_00->viewItems).d.size;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar5 = QHeaderView::resizeContentsPrecision(this_00->header);
    local_10c = 0;
    firstVisual = QTreeViewPrivate::firstVisibleItem(this_00,&local_10c);
    uVar6 = QTreeViewPrivate::lastVisibleItem(this_00,firstVisual,local_10c);
    iVar8 = (int)lVar4;
    if (((int)(uVar6 | firstVisual) < 0) || (lVar4 - 1U == (ulong)uVar6)) {
      uVar6 = iVar8 - 1;
      if (iVar5 < 0) {
        firstVisual = 0;
      }
      else if (iVar5 == 0) {
        pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
        firstVisual = 0;
        if (0 < (int)(iVar8 - 2U)) {
          uVar11 = iVar8 - 2U;
          for (iVar7 = ((pQVar9->data->crect).y2.m_i - (pQVar9->data->crect).y1.m_i) + 1;
              firstVisual = uVar11, 0 < iVar7; iVar7 = iVar7 - iVar15) {
            iVar15 = QTreeViewPrivate::itemHeight(this_00,uVar11);
            firstVisual = uVar11 - 1;
            if ((int)uVar11 < 2) break;
            uVar11 = uVar11 - 1;
          }
        }
      }
      else {
        firstVisual = 0;
        if (0 < (int)(uVar6 - iVar5)) {
          firstVisual = uVar6 - iVar5;
        }
      }
    }
    iVar7 = 0;
    iVar15 = 0;
    if ((int)firstVisual <= (int)uVar6) {
      pQVar14 = pQVar3 + (int)firstVisual;
      iVar15 = 0;
      iVar7 = 0;
      uVar11 = firstVisual;
      do {
        if ((pQVar14->field_0x1c & 2) == 0) {
          local_128.r = (pQVar14->index).r;
          local_128.c = (pQVar14->index).c;
          local_128.i = (pQVar14->index).i;
          local_128.m.ptr = (pQVar14->index).m.ptr;
          if (local_128.m.ptr == (QAbstractItemModel *)0x0) {
            local_148.r = -1;
            local_148.c = -1;
            local_148.i = 0;
            local_148.m.ptr = (QAbstractItemModel *)0x0;
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          else if ((pQVar14->index).c != column) {
            (**(code **)(*(long *)local_128.m.ptr + 0x70))
                      (&local_148,local_128.m.ptr,(pQVar14->index).r,column,&local_128);
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          local_148.m.ptr = local_128.m.ptr;
          local_148.i = local_128.i;
          local_148._0_8_ = local_128._0_8_;
          local_128.m.ptr = local_148.m.ptr;
          local_128.r = local_148.r;
          local_128.c = local_148.c;
          local_128.i = local_148.i;
          iVar7 = QTreeViewPrivate::widthHintForIndex(this_00,&local_128,iVar7,&local_108,uVar11);
          iVar15 = iVar15 + 1;
          if (iVar15 == iVar5) break;
        }
        uVar11 = uVar11 + 1;
        pQVar14 = pQVar14 + 1;
      } while (uVar6 + 1 != uVar11);
    }
    if (iVar15 != iVar5 && iVar5 != 0) {
      iVar8 = iVar8 + -1;
      iVar13 = uVar6 - 1;
      do {
        if (((int)firstVisual < 1) && (iVar8 <= iVar13)) break;
        if (((0 < (int)firstVisual & (byte)iVar15) == 0) && (iVar13 != iVar8)) {
          uVar12 = (ulong)iVar13;
          if (iVar13 <= iVar8) {
            iVar13 = iVar8;
          }
          pbVar10 = &pQVar3[uVar12 + 1].field_0x1c;
          do {
            if ((long)iVar8 <= (long)uVar12) {
              uVar12 = 0xffffffff;
              goto LAB_005b3f68;
            }
            uVar12 = uVar12 + 1;
            bVar1 = *pbVar10;
            pbVar10 = pbVar10 + 0x28;
          } while ((bVar1 & 2) != 0);
          iVar13 = (int)uVar12;
        }
        else {
          uVar12 = (ulong)firstVisual;
          uVar6 = (int)firstVisual >> 0x1f & firstVisual;
          do {
            uVar12 = uVar12 - 1;
            if ((int)firstVisual < 1) {
              uVar12 = 0xffffffff;
              firstVisual = uVar6;
              goto LAB_005b3f68;
            }
            firstVisual = firstVisual - 1;
          } while ((pQVar3[uVar12 & 0xffffffff].field_0x1c & 2) != 0);
          uVar12 = (ulong)firstVisual;
        }
LAB_005b3f68:
        if (-1 < (int)uVar12) {
          pQVar14 = pQVar3 + (uVar12 & 0xffffffff);
          local_128.r = (pQVar14->index).r;
          local_128.c = (pQVar14->index).c;
          local_128.i = (pQVar14->index).i;
          local_128.m.ptr = pQVar3[uVar12 & 0xffffffff].index.m.ptr;
          if (local_128.m.ptr == (QAbstractItemModel *)0x0) {
            local_148.r = -1;
            local_148.c = -1;
            local_148.i = 0;
            local_148.m.ptr = (QAbstractItemModel *)0x0;
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          else if ((pQVar14->index).c != column) {
            (**(code **)(*(long *)local_128.m.ptr + 0x70))
                      (&local_148,local_128.m.ptr,(pQVar14->index).r,column,&local_128);
            local_128._0_8_ = local_148._0_8_;
            local_128.i = local_148.i;
            local_128.m.ptr = local_148.m.ptr;
          }
          local_148.m.ptr = local_128.m.ptr;
          local_148.i = local_128.i;
          local_148._0_8_ = local_128._0_8_;
          local_128.m.ptr = local_148.m.ptr;
          local_128.r = local_148.r;
          local_128.c = local_148.c;
          local_128.i = local_148.i;
          iVar7 = QTreeViewPrivate::widthHintForIndex
                            (this_00,&local_128,iVar7,&local_108,(int)uVar12);
          iVar15 = iVar15 + 1;
        }
      } while (iVar15 != iVar5);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,0x28,0x10);
      }
    }
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeView::sizeHintForColumn(int column) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return -1;
    ensurePolished();
    int w = 0;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QList<QTreeViewItem> viewItems = d->viewItems;

    const int maximumProcessRows = d->header->resizeContentsPrecision(); // To avoid this to take forever.

    int offset = 0;
    int start = d->firstVisibleItem(&offset);
    int end = d->lastVisibleItem(start, offset);
    if (start < 0 || end < 0 || end == viewItems.size() - 1) {
        end = viewItems.size() - 1;
        if (maximumProcessRows < 0) {
            start = 0;
        } else if (maximumProcessRows == 0) {
            start = qMax(0, end - 1);
            int remainingHeight = viewport()->height();
            while (start > 0 && remainingHeight > 0) {
                remainingHeight -= d->itemHeight(start);
                --start;
            }
        } else {
            start = qMax(0, end - maximumProcessRows);
        }
    }

    int rowsProcessed = 0;

    for (int i = start; i <= end; ++i) {
        if (viewItems.at(i).spanning)
            continue; // we have no good size hint
        QModelIndex index = viewItems.at(i).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, i);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    --end;
    int actualBottom = viewItems.size() - 1;

    if (maximumProcessRows == 0)
        rowsProcessed = 0; // skip the while loop

    while (rowsProcessed != maximumProcessRows && (start > 0 || end < actualBottom)) {
        int idx  = -1;

        if ((rowsProcessed % 2 && start > 0) || end == actualBottom) {
            while (start > 0) {
                --start;
                if (viewItems.at(start).spanning)
                    continue;
                idx = start;
                break;
            }
        } else {
            while (end < actualBottom) {
                ++end;
                if (viewItems.at(end).spanning)
                    continue;
                idx = end;
                break;
            }
        }
        if (idx < 0)
            continue;

        QModelIndex index = viewItems.at(idx).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, idx);
        ++rowsProcessed;
    }
    return w;
}